

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

Query * plan_qstring(Query *__return_storage_ptr__,
                    unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
                    *types_to_query,QString *value)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  optional<unsigned_int> oVar6;
  int index;
  long lVar7;
  ulong uVar8;
  PrimitiveQuery local_80;
  vector<Query,_std::allocator<Query>_> plan;
  
  plan.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  plan.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  plan.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_80.itype = GRAM3;
  sVar2 = std::
          _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&types_to_query->_M_h,&local_80.itype);
  local_80.itype = TEXT4;
  sVar3 = std::
          _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&types_to_query->_M_h,&local_80.itype);
  local_80.itype = WIDE8;
  sVar4 = std::
          _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&types_to_query->_M_h,&local_80.itype);
  local_80.itype = HASH4;
  sVar5 = std::
          _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&types_to_query->_M_h,&local_80.itype);
  iVar1 = 0;
  uVar8 = 0;
LAB_0013ea42:
  lVar7 = (long)(int)uVar8;
  do {
    uVar8 = lVar7 + 2;
    if ((ulong)(((long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x18) <= uVar8) {
      q_and(__return_storage_ptr__,&plan);
      std::vector<Query,_std::allocator<Query>_>::~vector(&plan);
      return __return_storage_ptr__;
    }
    index = (int)lVar7;
    if (sVar4 != 0) {
      oVar6 = convert_gram(WIDE8,index,value);
      if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
        local_80.itype = WIDE8;
        local_80.trigram =
             oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
        std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>(&plan,&local_80);
        iVar1 = index + 6;
        goto LAB_0013ea42;
      }
    }
    if (sVar3 != 0) {
      oVar6 = convert_gram(TEXT4,index,value);
      if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) break;
    }
    oVar6 = convert_gram(HASH4,index,value);
    if ((iVar1 + -1 <= lVar7 && sVar5 != 0) &&
        ((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
      local_80.itype = HASH4;
      local_80.trigram =
           oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>(&plan,&local_80);
    }
    oVar6 = convert_gram(GRAM3,index,value);
    if (((iVar1 <= lVar7) && (sVar2 != 0)) &&
       (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0x100000000) != 0)) {
      local_80.itype = GRAM3;
      local_80.trigram =
           oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>(&plan,&local_80);
    }
    lVar7 = lVar7 + 1;
  } while( true );
  local_80.itype = TEXT4;
  local_80.trigram =
       oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>(&plan,&local_80);
  iVar1 = index + 2;
  uVar8 = lVar7 + 1;
  goto LAB_0013ea42;
}

Assistant:

Query plan_qstring(const std::unordered_set<IndexType> &types_to_query,
                   const QString &value) {
    std::vector<Query> plan;

    bool has_gram3 = types_to_query.count(IndexType::GRAM3) != 0;
    bool has_text4 = types_to_query.count(IndexType::TEXT4) != 0;
    bool has_wide8 = types_to_query.count(IndexType::WIDE8) != 0;
    bool has_hash4 = types_to_query.count(IndexType::HASH4) != 0;

    // `i` is the current index. `skip_to` is used to keep track of last
    // "handled" byte. For example there's no point in adding 3gram "bcd"
    // when 4gram "abcd" was already added. Only relevant for wide8 ngrams.
    int i = 0;
    int skip_to = 0;
    while (i + 2 < value.size()) {
        // If wide8 index is supported, try to add a token and skip 6 bytes.
        if (has_wide8) {
            if (const auto &gram = convert_gram(IndexType::WIDE8, i, value)) {
                plan.emplace_back(PrimitiveQuery(IndexType::WIDE8, *gram));
                skip_to = i + 6;
                i += 2;
                continue;
            }
        }
        // If text4 index is supported, try to add a token and skip 2 bytes.
        if (has_text4) {
            if (const auto &gram = convert_gram(IndexType::TEXT4, i, value)) {
                plan.emplace_back(PrimitiveQuery(IndexType::TEXT4, *gram));
                skip_to = i + 2;
                i += 1;
                continue;
            }
        }
        // If hash4 index is supported and current ngram is not text, try hash4.
        const auto &hgram = convert_gram(IndexType::HASH4, i, value);
        if (i >= (skip_to - 1) && has_hash4 && hgram) {
            plan.emplace_back(PrimitiveQuery(IndexType::HASH4, *hgram));
            // Don't continue here - gram3 can give us more information.
        }
        // Otherwise, add a regular gram3 token.
        const auto &gram = convert_gram(IndexType::GRAM3, i, value);
        if (i >= skip_to && gram) {
            if (has_gram3) {
                plan.emplace_back(PrimitiveQuery(IndexType::GRAM3, *gram));
            }
            i += 1;
            continue;
        }
        // If no ngram can be added, remember to move forward.
        i += 1;
    }

    return q_and(std::move(plan));
}